

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O0

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::line
          (rasterizer_cells_aa<agg::cell_aa> *this,int x1,int y1,int x2,int y2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint y1_00;
  uint y2_00;
  uint uVar5;
  long lVar6;
  int area;
  int two_fx;
  int ex;
  longlong p;
  int incr;
  int first;
  int delta;
  int lift;
  int mod;
  int rem;
  int x_to;
  int x_from;
  int fy2;
  int fy1;
  int ey2;
  int ey1;
  int ex2;
  int ex1;
  longlong dy;
  int cy;
  int cx;
  longlong dx;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  rasterizer_cells_aa<agg::cell_aa> *this_local;
  
  lVar6 = (long)x2 - (long)x1;
  if ((0x3fffff < lVar6) || (lVar6 < -0x3fffff)) {
    iVar1 = (int)((long)x1 + (long)x2 >> 1);
    iVar2 = (int)((long)y1 + (long)y2 >> 1);
    line(this,x1,y1,iVar1,iVar2);
    line(this,iVar1,iVar2,x2,y2);
  }
  _ex2 = (long)y2 - (long)y1;
  iVar1 = x1 >> 8;
  iVar2 = x2 >> 8;
  iVar3 = y1 >> 8;
  iVar4 = y2 >> 8;
  y1_00 = y1 & 0xff;
  y2_00 = y2 & 0xff;
  if (iVar1 < this->m_min_x) {
    this->m_min_x = iVar1;
  }
  if (this->m_max_x < iVar1) {
    this->m_max_x = iVar1;
  }
  if (iVar3 < this->m_min_y) {
    this->m_min_y = iVar3;
  }
  if (this->m_max_y < iVar3) {
    this->m_max_y = iVar3;
  }
  if (iVar2 < this->m_min_x) {
    this->m_min_x = iVar2;
  }
  if (this->m_max_x < iVar2) {
    this->m_max_x = iVar2;
  }
  if (iVar4 < this->m_min_y) {
    this->m_min_y = iVar4;
  }
  if (this->m_max_y < iVar4) {
    this->m_max_y = iVar4;
  }
  set_curr_cell(this,iVar1,iVar3);
  if (iVar3 == iVar4) {
    render_hline(this,iVar3,x1,y1_00,x2,y2_00);
  }
  else {
    p._0_4_ = 1;
    if (lVar6 == 0) {
      iVar2 = (x1 + iVar1 * -0x100) * 2;
      p._4_4_ = 0x100;
      if (_ex2 < 0) {
        p._4_4_ = 0;
        p._0_4_ = -1;
      }
      (this->m_curr_cell).cover = (p._4_4_ - y1_00) + (this->m_curr_cell).cover;
      (this->m_curr_cell).area = iVar2 * (p._4_4_ - y1_00) + (this->m_curr_cell).area;
      fy1 = (int)p + iVar3;
      set_curr_cell(this,iVar1,fy1);
      iVar3 = p._4_4_ * 2 + -0x100;
      while (fy1 != iVar4) {
        (this->m_curr_cell).cover = iVar3;
        (this->m_curr_cell).area = iVar2 * iVar3;
        fy1 = (int)p + fy1;
        set_curr_cell(this,iVar1,fy1);
      }
      iVar1 = (y2_00 - 0x100) + p._4_4_;
      (this->m_curr_cell).cover = iVar1 + (this->m_curr_cell).cover;
      (this->m_curr_cell).area = iVar2 * iVar1 + (this->m_curr_cell).area;
    }
    else {
      p._4_4_ = 0x100;
      uVar5 = 0x100 - y1_00;
      if (_ex2 < 0) {
        p._4_4_ = 0;
        p._0_4_ = -1;
        _ex2 = -_ex2;
        uVar5 = y1_00;
      }
      _two_fx = (int)uVar5 * lVar6;
      incr = (int)(_two_fx / _ex2);
      delta = (int)(_two_fx % _ex2);
      iVar1 = (int)_ex2;
      if (delta < 0) {
        incr = incr + -1;
        delta = delta + iVar1;
      }
      rem = x1 + incr;
      render_hline(this,iVar3,x1,y1_00,rem,p._4_4_);
      fy1 = (int)p + iVar3;
      set_curr_cell(this,rem >> 8,fy1);
      if (fy1 != iVar4) {
        first = (int)((lVar6 * 0x100) / _ex2);
        lift = (int)((lVar6 * 0x100) % _ex2);
        if (lift < 0) {
          first = first + -1;
          lift = lift + iVar1;
        }
        delta = delta - iVar1;
        while (fy1 != iVar4) {
          incr = first;
          delta = lift + delta;
          if (-1 < delta) {
            delta = delta - iVar1;
            incr = first + 1;
          }
          iVar2 = rem + incr;
          render_hline(this,fy1,rem,0x100 - p._4_4_,iVar2,p._4_4_);
          fy1 = (int)p + fy1;
          set_curr_cell(this,iVar2 >> 8,fy1);
          rem = iVar2;
        }
      }
      render_hline(this,fy1,rem,0x100 - p._4_4_,x2,y2_00);
    }
  }
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::line(int x1, int y1, int x2, int y2)
    {
        enum dx_limit_e { dx_limit = 16384 << poly_subpixel_shift };

        long long dx = (long long)x2 - (long long)x1;

        if(dx >= dx_limit || dx <= -dx_limit)
        {
            int cx = (int)(((long long)x1 + (long long)x2) >> 1);
            int cy = (int)(((long long)y1 + (long long)y2) >> 1);
            line(x1, y1, cx, cy);
            line(cx, cy, x2, y2);
        }

        long long dy = (long long)y2 - (long long)y1;
        int ex1 = x1 >> poly_subpixel_shift;
        int ex2 = x2 >> poly_subpixel_shift;
        int ey1 = y1 >> poly_subpixel_shift;
        int ey2 = y2 >> poly_subpixel_shift;
        int fy1 = y1 & poly_subpixel_mask;
        int fy2 = y2 & poly_subpixel_mask;

        int x_from, x_to;
        int rem, mod, lift, delta, first, incr;
        long long p;

        if(ex1 < m_min_x) m_min_x = ex1;
        if(ex1 > m_max_x) m_max_x = ex1;
        if(ey1 < m_min_y) m_min_y = ey1;
        if(ey1 > m_max_y) m_max_y = ey1;
        if(ex2 < m_min_x) m_min_x = ex2;
        if(ex2 > m_max_x) m_max_x = ex2;
        if(ey2 < m_min_y) m_min_y = ey2;
        if(ey2 > m_max_y) m_max_y = ey2;

        set_curr_cell(ex1, ey1);

        //everything is on a single hline
        if(ey1 == ey2)
        {
            render_hline(ey1, x1, fy1, x2, fy2);
            return;
        }

        //Vertical line - we have to calculate start and end cells,
        //and then - the common values of the area and coverage for
        //all cells of the line. We know exactly there's only one 
        //cell, so, we don't have to call render_hline().
        incr  = 1;
        if(dx == 0)
        {
            int ex = x1 >> poly_subpixel_shift;
            int two_fx = (x1 - (ex << poly_subpixel_shift)) << 1;
            int area;

            first = poly_subpixel_scale;
            if(dy < 0)
            {
                first = 0;
                incr  = -1;
            }

            x_from = x1;

            //render_hline(ey1, x_from, fy1, x_from, first);
            delta = first - fy1;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += two_fx * delta;

            ey1 += incr;
            set_curr_cell(ex, ey1);

            delta = first + first - poly_subpixel_scale;
            area = two_fx * delta;
            while(ey1 != ey2)
            {
                //render_hline(ey1, x_from, poly_subpixel_scale - first, x_from, first);
                m_curr_cell.cover = delta;
                m_curr_cell.area  = area;
                ey1 += incr;
                set_curr_cell(ex, ey1);
            }
            //render_hline(ey1, x_from, poly_subpixel_scale - first, x_from, fy2);
            delta = fy2 - poly_subpixel_scale + first;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += two_fx * delta;
            return;
        }

        //ok, we have to render several hlines
        p     = (poly_subpixel_scale - fy1) * dx;
        first = poly_subpixel_scale;

        if(dy < 0)
        {
            p     = fy1 * dx;
            first = 0;
            incr  = -1;
            dy    = -dy;
        }

        delta = (int)(p / dy);
        mod   = (int)(p % dy);

        if(mod < 0)
        {
            delta--;
            mod += dy;
        }

        x_from = x1 + delta;
        render_hline(ey1, x1, fy1, x_from, first);

        ey1 += incr;
        set_curr_cell(x_from >> poly_subpixel_shift, ey1);

        if(ey1 != ey2)
        {
            p     = poly_subpixel_scale * dx;
            lift  = (int)(p / dy);
            rem   = (int)(p % dy);

            if(rem < 0)
            {
                lift--;
                rem += dy;
            }
            mod -= dy;

            while(ey1 != ey2)
            {
                delta = lift;
                mod  += rem;
                if (mod >= 0)
                {
                    mod -= dy;
                    delta++;
                }

                x_to = x_from + delta;
                render_hline(ey1, x_from, poly_subpixel_scale - first, x_to, first);
                x_from = x_to;

                ey1 += incr;
                set_curr_cell(x_from >> poly_subpixel_shift, ey1);
            }
        }
        render_hline(ey1, x_from, poly_subpixel_scale - first, x2, fy2);
    }